

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

void strescape(char *s,char c)

{
  char cVar1;
  bool bVar2;
  char *out;
  char *pcVar3;
  
  bVar2 = false;
  for (pcVar3 = s; cVar1 = *pcVar3, cVar1 != '\0'; pcVar3 = pcVar3 + 1) {
    bVar2 = (bool)(cVar1 == c & (bVar2 ^ 1U));
    if (!bVar2) {
      *s = cVar1;
      s = s + 1;
    }
  }
  *s = '\0';
  return;
}

Assistant:

void strescape(char *s, const char c) {
	char *in = s;
	char *out = s;
	bool escapenext = false;
	while (*in) {
		if (*in != c || escapenext) {
			*out = *in;
			out++;
			escapenext = false;
		} else if (*in == c) {
			escapenext = true;
		}
		in++;
	}
	*out = 0;
}